

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zealot.c
# Opt level: O0

int get_bv_stage(CHAR_DATA *ch)

{
  bool bVar1;
  CHAR_DATA *in_RDI;
  AFFECT_DATA *af;
  AFFECT_DATA *local_18;
  int local_4;
  
  bVar1 = is_affected(in_RDI,(int)gsn_burning_vision);
  if (bVar1) {
    for (local_18 = in_RDI->affected;
        (local_18 != (AFFECT_DATA *)0x0 && (local_18->type != gsn_burning_vision));
        local_18 = local_18->next) {
    }
    local_4 = (0x14 - local_18->duration) / (int)local_18->modifier;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int get_bv_stage(CHAR_DATA *ch)
{
	AFFECT_DATA *af;

	if (!is_affected(ch, gsn_burning_vision) /*|| is_immortal(ch)*/)
		return -1;

	for (af = ch->affected; af != nullptr; af = af->next)
	{
		if (af->type == gsn_burning_vision)
			break;
	}

	return ((20 - af->duration) / af->modifier);
}